

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindFirstSets(lemon *lemp)

{
  rule **pprVar1;
  uint uVar2;
  Boolean BVar3;
  symbol **ppsVar4;
  symbol *psVar5;
  symbol *psVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  rule *prVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  rule *prVar17;
  
  iVar14 = lemp->nsymbol;
  if (0 < (long)iVar14) {
    ppsVar4 = lemp->symbols;
    lVar13 = 0;
    do {
      ppsVar4[lVar13]->lambda = LEMON_FALSE;
      lVar13 = lVar13 + 1;
    } while (iVar14 != lVar13);
  }
  lVar13 = (long)lemp->nterminal;
  if (lemp->nterminal < lemp->nsymbol) {
    do {
      pcVar10 = SetNew();
      lemp->symbols[lVar13]->firstset = pcVar10;
      lVar13 = lVar13 + 1;
    } while (lVar13 < lemp->nsymbol);
  }
  prVar17 = lemp->rule;
  if (prVar17 != (rule *)0x0) {
    bVar8 = false;
    prVar11 = prVar17;
    do {
      if (prVar11->lhs->lambda == LEMON_FALSE) {
        uVar2 = prVar11->nrhs;
        if ((int)uVar2 < 1) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            psVar5 = prVar11->rhs[uVar15];
            if ((psVar5->type != NONTERMINAL) && (psVar5->lambda != LEMON_FALSE)) {
              __assert_fail("sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE",
                            "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c"
                            ,0x35b,"void FindFirstSets(struct lemon *)");
            }
            if (psVar5->lambda == LEMON_FALSE) goto LAB_00102f6f;
            uVar15 = uVar15 + 1;
          } while (uVar2 != uVar15);
          uVar15 = (ulong)uVar2;
        }
LAB_00102f6f:
        if ((uint)uVar15 == uVar2) {
          prVar11->lhs->lambda = LEMON_TRUE;
          bVar8 = true;
        }
      }
      pprVar1 = &prVar11->next;
      prVar11 = *pprVar1;
    } while ((*pprVar1 != (rule *)0x0) ||
            ((bVar8 && (bVar8 = false, prVar11 = prVar17, prVar17 != (rule *)0x0))));
  }
  do {
    prVar17 = lemp->rule;
    if (prVar17 == (rule *)0x0) {
      return;
    }
    iVar14 = 0;
    do {
      if (0 < prVar17->nrhs) {
        psVar5 = prVar17->lhs;
        lVar13 = 0;
        while( true ) {
          psVar6 = prVar17->rhs[lVar13];
          if (psVar6->type == TERMINAL) {
            iVar9 = SetAdd(psVar5->firstset,psVar6->index);
            iVar14 = iVar14 + iVar9;
            goto LAB_00103077;
          }
          if (psVar6->type == MULTITERMINAL) break;
          if (psVar5 == psVar6) {
            BVar3 = psVar5->lambda;
          }
          else {
            lVar12 = (long)size;
            if (lVar12 < 1) {
              iVar9 = 0;
            }
            else {
              pcVar10 = psVar5->firstset;
              pcVar7 = psVar6->firstset;
              lVar16 = 0;
              iVar9 = 0;
              do {
                if ((pcVar7[lVar16] != '\0') && (pcVar10[lVar16] == '\0')) {
                  pcVar10[lVar16] = '\x01';
                  iVar9 = 1;
                }
                lVar16 = lVar16 + 1;
              } while (lVar12 != lVar16);
            }
            iVar14 = iVar14 + iVar9;
            BVar3 = psVar6->lambda;
          }
          if ((BVar3 == LEMON_FALSE) || (lVar13 = lVar13 + 1, prVar17->nrhs <= lVar13))
          goto LAB_00103077;
        }
        if (0 < psVar6->nsubsym) {
          lVar13 = 0;
          do {
            iVar9 = SetAdd(psVar5->firstset,psVar6->subsym[lVar13]->index);
            iVar14 = iVar14 + iVar9;
            lVar13 = lVar13 + 1;
          } while (lVar13 < psVar6->nsubsym);
        }
      }
LAB_00103077:
      prVar17 = prVar17->next;
    } while (prVar17 != (rule *)0x0);
    if (iVar14 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void FindFirstSets(struct lemon *lemp)
{
  int i, j;
  struct rule *rp;
  int progress;

  for(i=0; i<lemp->nsymbol; i++){
    lemp->symbols[i]->lambda = LEMON_FALSE;
  }
  for(i=lemp->nterminal; i<lemp->nsymbol; i++){
    lemp->symbols[i]->firstset = SetNew();
  }

  /* First compute all lambdas */
  do{
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      if( rp->lhs->lambda ) continue;
      for(i=0; i<rp->nrhs; i++){
        struct symbol *sp = rp->rhs[i];
        assert( sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE );
        if( sp->lambda==LEMON_FALSE ) break;
      }
      if( i==rp->nrhs ){
        rp->lhs->lambda = LEMON_TRUE;
        progress = 1;
      }
    }
  }while( progress );

  /* Now compute all first sets */
  do{
    struct symbol *s1, *s2;
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      s1 = rp->lhs;
      for(i=0; i<rp->nrhs; i++){
        s2 = rp->rhs[i];
        if( s2->type==TERMINAL ){
          progress += SetAdd(s1->firstset,s2->index);
          break;
        }else if( s2->type==MULTITERMINAL ){
          for(j=0; j<s2->nsubsym; j++){
            progress += SetAdd(s1->firstset,s2->subsym[j]->index);
          }
          break;
        }else if( s1==s2 ){
          if( s1->lambda==LEMON_FALSE ) break;
        }else{
          progress += SetUnion(s1->firstset,s2->firstset);
          if( s2->lambda==LEMON_FALSE ) break;
        }
      }
    }
  }while( progress );
  return;
}